

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messageobj.c
# Opt level: O0

TidyMessageImpl *
prvTidytidyMessageCreateWithLexer(TidyDocImpl *doc,uint code,TidyReportLevel level,...)

{
  char in_AL;
  TidyMessageImpl *pTVar1;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  uint local_100;
  uint local_fc;
  undefined1 local_f8 [24];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  uint local_40;
  uint local_3c;
  int col;
  int line;
  va_list args_copy;
  TidyMessageImpl *result;
  TidyReportLevel level_local;
  uint code_local;
  TidyDocImpl *doc_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  if (doc->lexer == (Lexer *)0x0) {
    local_fc = 0;
  }
  else {
    local_fc = doc->lexer->lines;
  }
  local_3c = local_fc;
  if (doc->lexer == (Lexer *)0x0) {
    local_100 = 0;
  }
  else {
    local_100 = doc->lexer->columns;
  }
  local_40 = local_100;
  args_copy[0].overflow_arg_area = local_f8;
  args_copy[0]._0_8_ = &stack0x00000008;
  line = 0x30;
  col = 0x18;
  local_e0 = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  pTVar1 = tidyMessageCreateInitV
                     (doc,(Node *)0x0,code,local_fc,local_100,level,(__va_list_tag *)&col);
  return pTVar1;
}

Assistant:

TidyMessageImpl *TY_(tidyMessageCreateWithLexer)( TidyDocImpl *doc,
                                                  uint code,
                                                  TidyReportLevel level,
                                                  ... )
{
    TidyMessageImpl *result;
    va_list args_copy;
    int line = ( doc->lexer ? doc->lexer->lines : 0 );
    int col  = ( doc->lexer ? doc->lexer->columns : 0 );
    
    va_start(args_copy, level);
    result = tidyMessageCreateInitV(doc, NULL, code, line, col, level, args_copy);
    va_end(args_copy);
    
    return result;
}